

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

ctmbstr GetColorCode(ctmbstr name,Bool use_css_colors)

{
  int iVar1;
  uint local_20;
  uint i;
  Bool use_css_colors_local;
  ctmbstr name_local;
  
  local_20 = 0;
  while (colors[local_20].name != (ctmbstr)0x0) {
    iVar1 = prvTidytmbstrcasecmp(name,colors[local_20].name);
    if (iVar1 == 0) {
      return colors[local_20].hex;
    }
    local_20 = local_20 + 1;
  }
  if (use_css_colors != no) {
    local_20 = 0;
    while (extended_colors[local_20].name != (ctmbstr)0x0) {
      iVar1 = prvTidytmbstrcasecmp(name,extended_colors[local_20].name);
      if (iVar1 == 0) {
        return extended_colors[local_20].hex;
      }
      local_20 = local_20 + 1;
    }
  }
  return (ctmbstr)0x0;
}

Assistant:

static ctmbstr GetColorCode(ctmbstr name, Bool use_css_colors)
{
    uint i;

    for (i = 0; colors[i].name; ++i)
        if (TY_(tmbstrcasecmp)(name, colors[i].name) == 0)
            return colors[i].hex;

    if (use_css_colors)
        for (i = 0; extended_colors[i].name; ++i)
            if (TY_(tmbstrcasecmp)(name, extended_colors[i].name) == 0)
                return extended_colors[i].hex;

    return NULL;
}